

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall gmath::PinholeCamera::PinholeCamera(PinholeCamera *this,PinholeCamera *pc)

{
  int iVar1;
  undefined4 extraout_var;
  
  Camera::Camera(&this->super_Camera,&pc->super_Camera);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__PinholeCamera_001738b0;
  SMatrix<double,_3,_3>::SMatrix(&this->A,&pc->A);
  this->rho = pc->rho;
  this->dist = (Distortion *)0x0;
  if (pc->dist != (Distortion *)0x0) {
    iVar1 = (*pc->dist->_vptr_Distortion[2])();
    this->dist = (Distortion *)CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

PinholeCamera::PinholeCamera(const PinholeCamera &pc) : Camera(pc), A(pc.A)
{
  rho=pc.rho;

  dist=0;

  if (pc.dist != 0)
  {
    dist=pc.dist->clone();
  }
}